

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

string * pbrt::ToString_abi_cxx11_(BxDFFlags flags)

{
  int iVar1;
  BxDFFlags in_ESI;
  string *in_RDI;
  string *s;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == Unset) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    iVar1 = operator&(in_ESI,Reflection);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Reflection,");
    }
    iVar1 = operator&(in_ESI,Transmission);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Transmission,");
    }
    iVar1 = operator&(in_ESI,Diffuse);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Diffuse,");
    }
    iVar1 = operator&(in_ESI,Glossy);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Glossy,");
    }
    iVar1 = operator&(in_ESI,Specular);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Specular,");
    }
  }
  return in_RDI;
}

Assistant:

std::string ToString(BxDFFlags flags) {
    if (flags == BxDFFlags::Unset)
        return "Unset";
    std::string s;
    if (flags & BxDFFlags::Reflection)
        s += "Reflection,";
    if (flags & BxDFFlags::Transmission)
        s += "Transmission,";
    if (flags & BxDFFlags::Diffuse)
        s += "Diffuse,";
    if (flags & BxDFFlags::Glossy)
        s += "Glossy,";
    if (flags & BxDFFlags::Specular)
        s += "Specular,";
    return s;
}